

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

int Curl_hash_delete(Curl_hash *h,void *key,size_t key_len)

{
  Curl_llist *pCVar1;
  size_t sVar2;
  size_t sVar3;
  Curl_llist_element *e;
  
  pCVar1 = h->table;
  sVar2 = (*h->hash_func)(key,key_len,(long)h->slots);
  e = pCVar1[sVar2].head;
  if (e != (Curl_llist_element *)0x0) {
    do {
      sVar3 = (*h->comp_func)((void *)((long)e->ptr + 0x28),*(size_t *)((long)e->ptr + 0x20),key,
                              key_len);
      if (sVar3 != 0) {
        Curl_llist_remove(pCVar1 + sVar2,e,h);
        h->size = h->size - 1;
        return 0;
      }
      e = e->next;
    } while (e != (Curl_llist_element *)0x0);
  }
  return 1;
}

Assistant:

int Curl_hash_delete(struct Curl_hash *h, void *key, size_t key_len)
{
  struct Curl_llist_element *le;
  struct Curl_llist *l = FETCH_LIST(h, key, key_len);

  for(le = l->head; le; le = le->next) {
    struct Curl_hash_element *he = le->ptr;
    if(h->comp_func(he->key, he->key_len, key, key_len)) {
      Curl_llist_remove(l, le, (void *) h);
      --h->size;
      return 0;
    }
  }
  return 1;
}